

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.cpp
# Opt level: O1

string * __thiscall
sqlcheck::PatternTypeToString_abi_cxx11_
          (string *__return_storage_ptr__,sqlcheck *this,PatternType *pattern_type)

{
  undefined4 uVar1;
  char *pcVar2;
  char *pcVar3;
  
  uVar1 = *(undefined4 *)this;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(uVar1) {
  case 1:
    pcVar3 = "PHYSICAL_DATABASE_DESIGN ANTI-PATTERN";
    pcVar2 = "";
    break;
  case 2:
    pcVar3 = "LOGICAL_DATABASE_DESIGN ANTI-PATTERN";
    pcVar2 = "";
    break;
  case 3:
    pcVar3 = "QUERY ANTI-PATTERN";
    pcVar2 = "";
    break;
  case 4:
    pcVar3 = "APPLICATION ANTI-PATTERN";
    pcVar2 = "";
    break;
  default:
    pcVar3 = "INVALID";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string PatternTypeToString(const PatternType& pattern_type){

  switch (pattern_type) {
    case PATTERN_TYPE_PHYSICAL_DATABASE_DESIGN:
      return "PHYSICAL_DATABASE_DESIGN ANTI-PATTERN";
    case PATTERN_TYPE_LOGICAL_DATABASE_DESIGN:
      return "LOGICAL_DATABASE_DESIGN ANTI-PATTERN";
    case PATTERN_TYPE_QUERY:
      return "QUERY ANTI-PATTERN";
    case PATTERN_TYPE_APPLICATION:
      return "APPLICATION ANTI-PATTERN";

    case PATTERN_TYPE_INVALID:
    default:
      return "INVALID";
  }

}